

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_outbound_item * nghttp2_session_get_next_ob_item(nghttp2_session *session)

{
  int iVar1;
  nghttp2_outbound_item *item;
  nghttp2_session *session_local;
  
  if ((session->ob_urgent).head == (nghttp2_outbound_item *)0x0) {
    if ((session->ob_reg).head == (nghttp2_outbound_item *)0x0) {
      iVar1 = session_is_outgoing_concurrent_streams_max(session);
      if ((iVar1 == 0) && ((session->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
        session_local = (nghttp2_session *)(session->ob_syn).head;
      }
      else if (session->remote_window_size < 1) {
        session_local = (nghttp2_session *)0x0;
      }
      else {
        session_local = (nghttp2_session *)nghttp2_stream_next_outbound_item(&session->root);
        if (session_local == (nghttp2_session *)0x0) {
          session_local = (nghttp2_session *)session_sched_get_next_outbound_item(session);
        }
      }
    }
    else {
      session_local = (nghttp2_session *)(session->ob_reg).head;
    }
  }
  else {
    session_local = (nghttp2_session *)(session->ob_urgent).head;
  }
  return (nghttp2_outbound_item *)session_local;
}

Assistant:

nghttp2_outbound_item *
nghttp2_session_get_next_ob_item(nghttp2_session *session) {
  nghttp2_outbound_item *item;

  if (nghttp2_outbound_queue_top(&session->ob_urgent)) {
    return nghttp2_outbound_queue_top(&session->ob_urgent);
  }

  if (nghttp2_outbound_queue_top(&session->ob_reg)) {
    return nghttp2_outbound_queue_top(&session->ob_reg);
  }

  if (!session_is_outgoing_concurrent_streams_max(session)) {
    if (nghttp2_outbound_queue_top(&session->ob_syn)) {
      return nghttp2_outbound_queue_top(&session->ob_syn);
    }
  }

  if (session->remote_window_size > 0) {
    item = nghttp2_stream_next_outbound_item(&session->root);
    if (item) {
      return item;
    }

    return session_sched_get_next_outbound_item(session);
  }

  return NULL;
}